

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrb_transient.h
# Opt level: O2

ref<immutable::transient_rrb<char,_false,_6>_> __thiscall
immutable::transient_rrb_push<char,false,6>
          (immutable *this,ref<immutable::transient_rrb<char,_false,_6>_> *trrb,char element)

{
  guid_type guid;
  char *pcVar1;
  tree_node<char,_false> *ptVar2;
  byte bVar3;
  transient_rrb<char,_false,_6> *ptVar4;
  leaf_node<char,_false> *plVar5;
  internal_node<char,_false> *piVar6;
  rrb_size_table<false> *prVar7;
  ref<immutable::rrb_details::internal_node<char,_false>_> *to_set;
  ref<immutable::rrb_details::internal_node<char,false>> *prVar8;
  uint uVar9;
  ulong uVar10;
  uint32_t uVar11;
  int iVar12;
  uint32_t uVar13;
  uint32_t uVar14;
  uint32_t uVar15;
  uint local_80;
  ref<immutable::rrb_details::internal_node<char,_false>_> current;
  ref<immutable::rrb_details::leaf_node<char,_false>_> old_tail;
  ref<immutable::rrb_details::internal_node<char,_false>_> new_root;
  ref<immutable::rrb_details::internal_node<char,_false>_> old_root;
  ref<immutable::rrb_details::leaf_node<char,_false>_> new_tail;
  ref<immutable::rrb_details::rrb_size_table<false>_> local_38;
  
  rrb_details::check_transience<char,false,6>(trrb);
  ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
  uVar9 = ptVar4->tail_len;
  ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
  if (uVar9 < 0x40) {
    plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&ptVar4->tail);
    pcVar1 = plVar5->child;
    ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
    pcVar1[ptVar4->tail_len] = element;
    ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
    ptVar4->cnt = ptVar4->cnt + 1;
    ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
    ptVar4->tail_len = ptVar4->tail_len + 1;
    ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
    plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&ptVar4->tail);
    plVar5->len = plVar5->len + 1;
    ptVar4 = trrb->ptr;
    *(transient_rrb<char,_false,_6> **)this = ptVar4;
    if (ptVar4 != (transient_rrb<char,_false,_6> *)0x0) {
      ptVar4->_ref_count = ptVar4->_ref_count + 1;
    }
  }
  else {
    ptVar4->cnt = ptVar4->cnt + 1;
    ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
    guid = ptVar4->guid;
    new_tail.ptr = rrb_details::transient_leaf_node_create<char,false,6>();
    if (new_tail.ptr != (leaf_node<char,_false> *)0x0) {
      (new_tail.ptr)->_ref_count = 1;
    }
    plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&new_tail);
    plVar5->guid = guid;
    plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&new_tail);
    *plVar5->child = element;
    plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&new_tail);
    plVar5->len = 1;
    ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
    ptVar4->tail_len = 1;
    ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
    old_tail.ptr = (ptVar4->tail).ptr;
    if (old_tail.ptr != (leaf_node<char,_false> *)0x0) {
      (old_tail.ptr)->_ref_count = (old_tail.ptr)->_ref_count + 1;
    }
    ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
    ref<immutable::rrb_details::leaf_node<char,_false>_>::operator=(&ptVar4->tail,&new_tail);
    ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
    ptVar2 = (ptVar4->root).ptr;
    ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
    if (ptVar2 == (tree_node<char,_false> *)0x0) {
      ptVar4->shift = 0;
      ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
      ref<immutable::rrb_details::tree_node<char,false>>::operator=
                ((ref<immutable::rrb_details::tree_node<char,false>> *)&ptVar4->root,&old_tail);
      ptVar4 = trrb->ptr;
      *(transient_rrb<char,_false,_6> **)this = ptVar4;
      if (ptVar4 != (transient_rrb<char,_false,_6> *)0x0) {
        ptVar4->_ref_count = ptVar4->_ref_count + 1;
      }
    }
    else {
      uVar14 = ptVar4->cnt;
      ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
      current.ptr = (internal_node<char,_false> *)(ptVar4->root).ptr;
      if (current.ptr != (internal_node<char,_false> *)0x0) {
        (current.ptr)->_ref_count = (current.ptr)->_ref_count + 1;
      }
      local_80 = uVar14 - 2;
      ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
      uVar14 = ptVar4->shift;
      iVar12 = uVar14 + 5;
      uVar13 = 0;
      uVar15 = 0;
      for (; uVar11 = uVar13, 6 < uVar14; uVar14 = uVar14 - 6) {
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&current);
        if ((piVar6->size_table).ptr == (rrb_size_table<false> *)0x0) {
          bVar3 = (byte)uVar14;
          if (local_80 >> (bVar3 + 6 & 0x1f) != 0) {
            uVar15 = uVar15 + 1;
            goto LAB_0014bce1;
          }
          uVar9 = local_80 >> (bVar3 & 0x1f) & 0x3f;
          local_80 = local_80 & ~(0x3f << (bVar3 & 0x1f));
LAB_0014bc29:
          if (uVar9 < 0x3f) {
            uVar13 = uVar15 + 1;
          }
          uVar10 = (ulong)uVar9;
        }
        else {
          piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&current);
          uVar11 = piVar6->len;
          uVar9 = uVar11 - 1;
          if (uVar9 != 0) {
            piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&current);
            prVar7 = ref<immutable::rrb_details::rrb_size_table<false>_>::operator->
                               (&piVar6->size_table);
            local_80 = local_80 - prVar7->size[uVar11 - 2];
            goto LAB_0014bc29;
          }
          uVar13 = uVar15 + 1;
          uVar10 = 0;
        }
        uVar11 = uVar15 + 1;
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&current);
        ref<immutable::rrb_details::internal_node<char,_false>_>::operator=
                  (&current,piVar6->child + uVar10);
        uVar15 = uVar11;
        if (current.ptr == (internal_node<char,_false> *)0x0) goto LAB_0014bce1;
        iVar12 = iVar12 + -6;
      }
      if (uVar14 != 0) {
        uVar15 = uVar15 + 1;
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&current);
        if (piVar6->len < 0x40) {
          ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&current);
          uVar11 = uVar15;
        }
      }
LAB_0014bce1:
      if (5 < uVar14) {
        uVar14 = 6;
      }
      uVar15 = (iVar12 - uVar14) / 6 + uVar15;
      if (uVar11 == 0) {
        ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
        old_root.ptr = (internal_node<char,_false> *)(ptVar4->root).ptr;
        if (old_root.ptr != (internal_node<char,_false> *)0x0) {
          (old_root.ptr)->_ref_count = (old_root.ptr)->_ref_count + 1;
        }
        new_root.ptr = rrb_details::transient_internal_node_create<char,false,6>();
        if (new_root.ptr != (internal_node<char,_false> *)0x0) {
          (new_root.ptr)->_ref_count = 1;
        }
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&new_root);
        piVar6->guid = guid;
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&new_root);
        piVar6->len = 2;
        ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&new_root);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::internal_node<char,false>> *)piVar6->child,
                   &ptVar4->root);
        ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
        ref<immutable::rrb_details::tree_node<char,false>>::operator=
                  ((ref<immutable::rrb_details::tree_node<char,false>> *)&ptVar4->root,&new_root);
        ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
        uVar14 = ptVar4->shift;
        ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
        ptVar4->shift = uVar14 + 6;
        piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&old_root);
        if ((piVar6->type != LEAF_NODE) &&
           (((old_root.ptr)->size_table).ptr != (rrb_size_table<false> *)0x0)) {
          prVar7 = rrb_details::transient_size_table_create<6,false>();
          prVar7->guid = guid;
          ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
          uVar14 = ptVar4->cnt;
          plVar5 = ref<immutable::rrb_details::leaf_node<char,_false>_>::operator->(&old_tail);
          *prVar7->size = ~plVar5->len + uVar14;
          ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
          prVar7->size[1] = ptVar4->cnt - 1;
          prVar7->_ref_count = 1;
          local_38.ptr = prVar7;
          piVar6 = ref<immutable::rrb_details::internal_node<char,_false>_>::operator->(&new_root);
          ref<immutable::rrb_details::rrb_size_table<false>_>::operator=
                    (&piVar6->size_table,&local_38);
          rrb_details::release(local_38.ptr);
        }
        ptVar4 = ref<immutable::transient_rrb<char,_false,_6>_>::operator->(trrb);
        prVar8 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                 rrb_details::new_editable_path<char,false,6>
                           ((ref<immutable::rrb_details::internal_node<char,_false>_> *)
                            (*(long *)&(ptVar4->root).ptr[1]._ref_count + 8),uVar15,guid);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=(prVar8,&old_tail);
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&new_root);
        ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&old_root);
      }
      else {
        to_set = rrb_details::mutate_first_k<char,false,6>(trrb,uVar11);
        prVar8 = (ref<immutable::rrb_details::internal_node<char,false>> *)
                 rrb_details::new_editable_path<char,false,6>(to_set,uVar15 - uVar11,guid);
        ref<immutable::rrb_details::internal_node<char,false>>::operator=(prVar8,&old_tail);
      }
      ptVar4 = trrb->ptr;
      *(transient_rrb<char,_false,_6> **)this = ptVar4;
      if (ptVar4 != (transient_rrb<char,_false,_6> *)0x0) {
        ptVar4->_ref_count = ptVar4->_ref_count + 1;
      }
      ref<immutable::rrb_details::internal_node<char,_false>_>::~ref(&current);
    }
    rrb_details::release<char>(old_tail.ptr);
    rrb_details::release<char>(new_tail.ptr);
  }
  return (ref<immutable::transient_rrb<char,_false,_6>_>)(transient_rrb<char,_false,_6> *)this;
}

Assistant:

inline ref<transient_rrb<T, atomic_ref_counting, N>> transient_rrb_push(ref<transient_rrb<T, atomic_ref_counting, N>>& trrb, T element)
    {
    using namespace rrb_details;
    check_transience(trrb);
    if (trrb->tail_len < bits<N>::rrb_branching)
      {
      T* loc = (T*)((char*)trrb->tail->child + trrb->tail_len * sizeof(T));
      loc = new(loc) T(std::move(element)); // placement new      

      //trrb->tail->child[trrb->tail_len] = std::move(element);
      trrb->cnt++;
      trrb->tail_len++;
      trrb->tail->len++;
      // ^ consider deferring incrementing this until insertion and/or persistentified.
      return trrb;
      }

    trrb->cnt++;
    guid_type guid = trrb->guid;
    ref<leaf_node<T, atomic_ref_counting>> new_tail = transient_leaf_node_create<T, atomic_ref_counting, N>();
    new_tail->guid = guid;
    
    T* loc = (T*)((char*)new_tail->child);
    loc = new(loc) T(std::move(element)); // placement new   

    //new_tail->child[0] = std::move(element);
    new_tail->len = 1;
    trrb->tail_len = 1;

    ref<leaf_node<T, atomic_ref_counting>> old_tail = trrb->tail;
    trrb->tail = new_tail;

    if (trrb->root.ptr == nullptr)
      { // If it's  null, we can't just mutate it down.
      trrb->shift = 0;
      trrb->root = old_tail;
      return trrb;
      }
    // mutable count starts here

    // TODO: Can find last rightmost jump in constant time for pvec subvecs:
    // use the fact that (index & large_mask) == 1 << (RRB_BITS * H) - 1 -> 0 etc.

    uint32_t index = trrb->cnt - 2;

    uint32_t nodes_to_mutate = 0;
    uint32_t nodes_visited = 0;
    uint32_t pos = 0; // pos is the position we insert empty nodes in the bottom
                      // mutable node (or the element, if we can mutate the leaf)
    ref<internal_node<T, atomic_ref_counting>> current = trrb->root;

    uint32_t shift = trrb->shift;

    // checking all non-leaf nodes (or if tail, all but the lowest two levels)
    while (shift > bits<N>::rrb_bits)
      {
      // calculate child index
      uint32_t child_index;
      if (current->size_table.ptr == nullptr)
        {
        // some check here to ensure we're not overflowing the pvec subvec.
        // important to realise that this only needs to be done once in a better
        // impl, the same way the size_table check only has to be done until it's
        // false.
        const uint32_t prev_shift = shift + bits<N>::rrb_bits;
        if (index >> prev_shift > 0)
          {
          nodes_visited++; // this could possibly be done earlier in the code.
          goto mutable_count_end;
          }
        child_index = (index >> shift) & bits<N>::rrb_mask;
        // index filtering is not necessary when the check above is performed at
        // most once.
        index &= ~(bits<N>::rrb_mask << shift);
        }
      else
        {
        // no need for sized_pos here, luckily.
        child_index = current->len - 1;
        // Decrement index
        if (child_index != 0)
          {
          index -= current->size_table->size[child_index - 1];
          }
        }
      nodes_visited++;
      if (child_index < bits<N>::rrb_mask)
        {
        nodes_to_mutate = nodes_visited;
        pos = child_index;
        }

      current = current->child[child_index];
      // This will only happen in a pvec subtree
      if (current.ptr == nullptr)
        {
        nodes_to_mutate = nodes_visited;
        pos = child_index;

        // if next element we're looking at is null, we can mutate all above. Good
        // times.
        goto mutable_count_end;
        }
      shift -= bits<N>::rrb_bits;
      }
    // if we're here, we're at the leaf node (or lowest non-leaf), which is
    // `current`

    // no need to even use index here: We know it'll be placed at current->len,
    // if there's enough space. That check is easy.
    if (shift != 0)
      {
      nodes_visited++;
      if (current->len < bits<N>::rrb_branching)
        {
        nodes_to_mutate = nodes_visited;
        pos = current->len;
        }
      }

  mutable_count_end:
    // GURRHH, nodes_visited is not yet handled nicely. loop down to get
    // nodes_visited set straight.
    while (shift > bits<N>::rrb_bits)
      {
      nodes_visited++;
      shift -= bits<N>::rrb_bits;
      }

    // Increasing height of tree.
    if (nodes_to_mutate == 0)
      {
      ref<internal_node<T, atomic_ref_counting>> old_root = trrb->root;
      ref<internal_node<T, atomic_ref_counting>> new_root = transient_internal_node_create<T, atomic_ref_counting, N>();
      new_root->guid = guid;
      new_root->len = 2;
      new_root->child[0] = trrb->root;
      trrb->root = new_root;
      trrb->shift = trrb->shift + bits<N>::rrb_bits;

      // create size table if the original rrb root has a size table.
      if (old_root->type != LEAF_NODE && ((const internal_node<T, atomic_ref_counting> *)old_root.ptr)->size_table.ptr != nullptr)
        {
        rrb_size_table<atomic_ref_counting>* table = transient_size_table_create<N, atomic_ref_counting>();
        table->guid = guid;
        table->size[0] = trrb->cnt - (old_tail->len + 1);
        // If we insert the tail, the old size minus (new size minus one) the old
        // tail size will be the amount of elements in the left branch. If there
        // is no tail, the size is just the old rrb-tree.

        table->size[1] = trrb->cnt - 1;
        // If we insert the tail, the old size would include the tail.
        // Consequently, it has to be the old size. If we have no tail, we append
        // a single element to the old vector, therefore it has to be one more
        // than the original (which means it is zero)

        new_root->size_table = table;
        }

      // nodes visited == original rrb tree height. Nodes visited > 0.
      ref<internal_node<T, atomic_ref_counting>>* to_set = new_editable_path<T, atomic_ref_counting, N>(&((internal_node<T, atomic_ref_counting> *)trrb->root.ptr)->child[1], nodes_visited, guid);
      *to_set = old_tail;
      }
    else
      {
      ref<internal_node<T, atomic_ref_counting>>* node = mutate_first_k(trrb, nodes_to_mutate);
      ref<internal_node<T, atomic_ref_counting>>* to_set = new_editable_path<T, atomic_ref_counting, N>(node, nodes_visited - nodes_to_mutate, guid);
      *to_set = old_tail;
      }

    return trrb;
    }